

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rect.c
# Opt level: O0

void split_rects(nhrect *r1,nhrect *r2)

{
  nhrect nVar1;
  boolean bVar2;
  int iVar3;
  int local_24;
  char local_20;
  char cStack_1f;
  char cStack_1e;
  char cStack_1d;
  int i;
  nhrect old_r;
  nhrect r;
  nhrect *r2_local;
  nhrect *r1_local;
  
  nVar1 = *r1;
  _old_r = r2;
  remove_rect(r1);
  local_24 = rect_cnt;
  while (local_24 = local_24 + -1, -1 < local_24) {
    bVar2 = intersect(rect + local_24,_old_r,(nhrect *)&i);
    if (bVar2 != '\0') {
      split_rects(rect + local_24,(nhrect *)&i);
    }
  }
  cStack_1f = nVar1.ly;
  cStack_1d = nVar1.hy;
  iVar3 = 4;
  if (cStack_1d < '\x14') {
    iVar3 = 6;
  }
  if (iVar3 + 4 < ((int)_old_r->ly - (int)cStack_1f) + -1) {
    i._0_3_ = nVar1._0_3_;
    i = CONCAT13(_old_r->ly + -2,(undefined3)i);
    add_rect((nhrect *)&i);
  }
  local_20 = nVar1.lx;
  cStack_1e = nVar1.hx;
  iVar3 = 5;
  if (cStack_1e < 'O') {
    iVar3 = 8;
  }
  if (iVar3 + 4 < ((int)_old_r->lx - (int)local_20) + -1) {
    i._0_2_ = nVar1._0_2_;
    i._0_3_ = CONCAT12(_old_r->lx + -2,(undefined2)i);
    i = CONCAT13(cStack_1d,(undefined3)i);
    add_rect((nhrect *)&i);
  }
  iVar3 = 4;
  if ('\0' < cStack_1f) {
    iVar3 = 6;
  }
  if (iVar3 + 4 < ((int)cStack_1d - (int)_old_r->hy) + -1) {
    i._2_2_ = nVar1._2_2_;
    i._0_2_ = CONCAT11(_old_r->hy + '\x02',local_20);
    add_rect((nhrect *)&i);
  }
  iVar3 = 5;
  if ('\0' < local_20) {
    iVar3 = 8;
  }
  if (iVar3 + 4 < ((int)cStack_1e - (int)_old_r->hx) + -1) {
    i = CONCAT31(nVar1._1_3_,_old_r->hx + '\x02');
    add_rect((nhrect *)&i);
  }
  return;
}

Assistant:

void split_rects(struct nhrect *r1, struct nhrect *r2)
{
	struct nhrect r, old_r;
	int i;

	old_r = *r1;
	remove_rect(r1);

	/* Walk down since rect_cnt & rect[] will change... */
	for (i=rect_cnt-1; i>=0; i--)
	    if (intersect(&rect[i], r2, &r))
		split_rects(&rect[i], &r);
	
	if (r2->ly - old_r.ly-1 > (old_r.hy < ROWNO - 1 ? 2*YLIM : YLIM+1)+4) {
		r = old_r;
		r.hy = r2->ly - 2;
		add_rect(&r);
	}
	if (r2->lx - old_r.lx-1 > (old_r.hx < COLNO - 1 ? 2*XLIM : XLIM+1)+4) {
		r = old_r;
		r.hx = r2->lx - 2;
		add_rect(&r);
	}
	if (old_r.hy - r2->hy-1 > (old_r.ly > 0 ? 2*YLIM : YLIM+1)+4) {
		r = old_r;
		r.ly = r2->hy + 2;
		add_rect(&r);
	}
	if (old_r.hx - r2->hx-1 > (old_r.lx > 0 ? 2*XLIM : XLIM+1)+4) {
		r = old_r;
		r.lx = r2->hx + 2;
		add_rect(&r);
	}
}